

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStairFlightType::IfcStairFlightType(IfcStairFlightType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcStairFlightType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00770808);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7706d8;
  *(undefined8 *)&this->field_0x1c0 = 0x7707f0;
  *(undefined8 *)&this->field_0x88 = 0x770700;
  *(undefined8 *)&this->field_0x98 = 0x770728;
  *(undefined8 *)&this->field_0xf0 = 0x770750;
  *(undefined8 *)&this->field_0x148 = 0x770778;
  *(undefined8 *)&this->field_0x180 = 0x7707a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x7707c8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcStairFlightType() : Object("IfcStairFlightType") {}